

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 (*pauVar26) [16];
  long lVar27;
  undefined4 uVar28;
  ulong uVar29;
  byte bVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  long lVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  __m128 a;
  undefined1 auVar86 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  __m128 a_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar99;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar100 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2870 [16];
  undefined8 local_2850;
  undefined1 local_2830 [16];
  undefined1 (*local_2818) [16];
  ulong local_2810;
  ulong local_2808;
  ulong local_2800;
  ulong local_27f8;
  ulong local_27f0;
  ulong local_27e8;
  long local_27e0;
  long local_27d8;
  long local_27d0;
  ulong local_27c8;
  undefined1 local_27c0 [32];
  RTCFilterFunctionNArguments local_2790;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined4 local_26b0;
  undefined4 uStack_26ac;
  undefined4 uStack_26a8;
  undefined4 uStack_26a4;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float local_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined1 local_2650 [16];
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined1 local_2620 [8];
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_2580 [32];
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar116 [32];
  
  pauVar26 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2720._4_4_ = fVar1;
  local_2720._0_4_ = fVar1;
  local_2720._8_4_ = fVar1;
  local_2720._12_4_ = fVar1;
  local_2720._16_4_ = fVar1;
  local_2720._20_4_ = fVar1;
  local_2720._24_4_ = fVar1;
  local_2720._28_4_ = fVar1;
  auVar88 = ZEXT3264(local_2720);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2740._4_4_ = fVar60;
  local_2740._0_4_ = fVar60;
  local_2740._8_4_ = fVar60;
  local_2740._12_4_ = fVar60;
  local_2740._16_4_ = fVar60;
  local_2740._20_4_ = fVar60;
  local_2740._24_4_ = fVar60;
  local_2740._28_4_ = fVar60;
  auVar92 = ZEXT3264(local_2740);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2760._4_4_ = fVar66;
  local_2760._0_4_ = fVar66;
  local_2760._8_4_ = fVar66;
  local_2760._12_4_ = fVar66;
  local_2760._16_4_ = fVar66;
  local_2760._20_4_ = fVar66;
  local_2760._24_4_ = fVar66;
  local_2760._28_4_ = fVar66;
  auVar93 = ZEXT3264(local_2760);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar31 = (tray->tfar).field_0.i[k];
  auVar96 = ZEXT3264(CONCAT428(iVar31,CONCAT424(iVar31,CONCAT420(iVar31,CONCAT416(iVar31,CONCAT412(
                                                  iVar31,CONCAT48(iVar31,CONCAT44(iVar31,iVar31)))))
                                               )));
  local_2400._8_4_ = 0x80000000;
  local_2400._0_8_ = 0x8000000080000000;
  local_2400._12_4_ = 0x80000000;
  local_2400._16_4_ = 0x80000000;
  local_2400._20_4_ = 0x80000000;
  local_2400._24_4_ = 0x80000000;
  local_2400._28_4_ = 0x80000000;
  local_27c0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_27c0._8_4_ = -fVar1;
  local_27c0._12_4_ = -fVar1;
  local_27c0._16_4_ = -fVar1;
  local_27c0._20_4_ = -fVar1;
  local_27c0._24_4_ = -fVar1;
  local_27c0._28_4_ = -fVar1;
  auVar85 = ZEXT3264(local_27c0);
  local_2420._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar60;
  local_2420._12_4_ = -fVar60;
  local_2420._16_4_ = -fVar60;
  local_2420._20_4_ = -fVar60;
  local_2420._24_4_ = -fVar60;
  local_2420._28_4_ = -fVar60;
  auVar100 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar66;
  local_2440._12_4_ = -fVar66;
  local_2440._16_4_ = -fVar66;
  local_2440._20_4_ = -fVar66;
  local_2440._24_4_ = -fVar66;
  local_2440._28_4_ = -fVar66;
  auVar110 = ZEXT3264(local_2440);
  iVar31 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar31;
  local_2460._0_4_ = iVar31;
  local_2460._8_4_ = iVar31;
  local_2460._12_4_ = iVar31;
  local_2460._16_4_ = iVar31;
  local_2460._20_4_ = iVar31;
  local_2460._24_4_ = iVar31;
  local_2460._28_4_ = iVar31;
  auVar113 = ZEXT3264(local_2460);
  local_27e8 = uVar43 >> 2;
  local_27f0 = (uVar43 ^ 0x20) >> 2;
  local_2480._16_16_ = mm_lookupmask_ps._240_16_;
  local_2480._0_16_ = mm_lookupmask_ps._0_16_;
  local_2818 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_27f8 = uVar44 >> 2;
  local_2800 = (uVar44 ^ 0x20) >> 2;
  local_2808 = uVar45 >> 2;
  local_2810 = (uVar45 ^ 0x20) >> 2;
  auVar87._8_4_ = 0xbf800000;
  auVar87._0_8_ = 0xbf800000bf800000;
  auVar87._12_4_ = 0xbf800000;
  auVar87._16_4_ = 0xbf800000;
  auVar87._20_4_ = 0xbf800000;
  auVar87._24_4_ = 0xbf800000;
  auVar87._28_4_ = 0xbf800000;
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = 0x3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  _local_24a0 = vblendvps_avx(auVar62,auVar87,local_2480);
LAB_005f7ff8:
  do {
    pauVar41 = pauVar26 + -1;
    pauVar26 = pauVar26 + -1;
    if (*(float *)(*pauVar41 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar46 = *(ulong *)*pauVar26;
joined_r0x005f8017:
      if ((uVar46 & 8) == 0) {
        auVar86 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar43),auVar85._0_32_,
                                  auVar88._0_32_);
        auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar44),auVar100._0_32_,
                                  auVar92._0_32_);
        auVar87 = vpmaxsd_avx2(ZEXT1632(auVar86),ZEXT1632(auVar14));
        auVar86 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar45),auVar110._0_32_,
                                  auVar93._0_32_);
        auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar43 ^ 0x20)),
                                  auVar85._0_32_,auVar88._0_32_);
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar44 ^ 0x20)),
                                  auVar100._0_32_,auVar92._0_32_);
        auVar75 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar50));
        auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar45 ^ 0x20)),
                                  auVar110._0_32_,auVar93._0_32_);
        auVar62 = vpmaxsd_avx2(ZEXT1632(auVar86),auVar113._0_32_);
        _local_2620 = vpmaxsd_avx2(auVar87,auVar62);
        auVar87 = vpminsd_avx2(ZEXT1632(auVar14),auVar96._0_32_);
        auVar87 = vpminsd_avx2(auVar75,auVar87);
        auVar87 = vpcmpgtd_avx2(_local_2620,auVar87);
        iVar31 = vmovmskps_avx(auVar87);
        if (iVar31 == 0xff) {
          if (pauVar26 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005f7ff8;
        }
        bVar30 = ~(byte)iVar31;
        uVar29 = uVar46 & 0xfffffffffffffff0;
        lVar27 = 0;
        for (uVar46 = (ulong)bVar30; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar46 = *(ulong *)(uVar29 + lVar27 * 8);
        uVar32 = bVar30 - 1 & (uint)bVar30;
        uVar35 = (ulong)uVar32;
        if (uVar32 != 0) {
          uVar11 = *(uint *)(local_2620 + lVar27 * 4);
          lVar27 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar40 = (ulong)uVar32;
          uVar35 = *(ulong *)(uVar29 + lVar27 * 8);
          uVar99 = *(uint *)(local_2620 + lVar27 * 4);
          if (uVar32 != 0) {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar46;
            auVar86 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar11));
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar35;
            auVar14 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar99));
            lVar27 = 0;
            for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
            uVar32 = uVar32 - 1 & uVar32;
            uVar46 = (ulong)uVar32;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(uVar29 + lVar27 * 8);
            auVar4 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_2620 + lVar27 * 4)));
            auVar50 = vpcmpgtd_avx(auVar14,auVar86);
            if (uVar32 == 0) {
              auVar5 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar14,auVar86,auVar5);
              auVar86 = vblendvps_avx(auVar86,auVar14,auVar5);
              auVar14 = vpcmpgtd_avx(auVar4,auVar50);
              auVar5 = vpshufd_avx(auVar14,0xaa);
              auVar14 = vblendvps_avx(auVar4,auVar50,auVar5);
              auVar50 = vblendvps_avx(auVar50,auVar4,auVar5);
              auVar4 = vpcmpgtd_avx(auVar50,auVar86);
              auVar5 = vpshufd_avx(auVar4,0xaa);
              auVar4 = vblendvps_avx(auVar50,auVar86,auVar5);
              auVar86 = vblendvps_avx(auVar86,auVar50,auVar5);
              *pauVar26 = auVar86;
              pauVar26[1] = auVar4;
              uVar46 = auVar14._0_8_;
              pauVar41 = pauVar26 + 2;
            }
            else {
              lVar27 = 0;
              for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                lVar27 = lVar27 + 1;
              }
              uVar32 = uVar32 - 1 & uVar32;
              uVar35 = (ulong)uVar32;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(uVar29 + lVar27 * 8);
              auVar5 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_2620 + lVar27 * 4)));
              if (uVar32 == 0) {
                auVar6 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar14,auVar86,auVar6);
                auVar86 = vblendvps_avx(auVar86,auVar14,auVar6);
                auVar14 = vpcmpgtd_avx(auVar5,auVar4);
                auVar6 = vpshufd_avx(auVar14,0xaa);
                auVar14 = vblendvps_avx(auVar5,auVar4,auVar6);
                auVar4 = vblendvps_avx(auVar4,auVar5,auVar6);
                auVar5 = vpcmpgtd_avx(auVar4,auVar86);
                auVar6 = vpshufd_avx(auVar5,0xaa);
                auVar5 = vblendvps_avx(auVar4,auVar86,auVar6);
                auVar86 = vblendvps_avx(auVar86,auVar4,auVar6);
                auVar4 = vpcmpgtd_avx(auVar14,auVar50);
                auVar6 = vpshufd_avx(auVar4,0xaa);
                auVar4 = vblendvps_avx(auVar14,auVar50,auVar6);
                auVar14 = vblendvps_avx(auVar50,auVar14,auVar6);
                auVar50 = vpcmpgtd_avx(auVar5,auVar14);
                auVar6 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar5,auVar14,auVar6);
                auVar14 = vblendvps_avx(auVar14,auVar5,auVar6);
                *pauVar26 = auVar86;
                pauVar26[1] = auVar14;
                pauVar26[2] = auVar50;
                uVar46 = auVar4._0_8_;
                pauVar41 = pauVar26 + 3;
              }
              else {
                *pauVar26 = auVar86;
                pauVar26[1] = auVar14;
                pauVar26[2] = auVar4;
                pauVar26[3] = auVar5;
                lVar27 = 0x30;
                do {
                  lVar37 = lVar27;
                  lVar27 = 0;
                  for (uVar46 = uVar35; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000
                      ) {
                    lVar27 = lVar27 + 1;
                  }
                  uVar46 = *(ulong *)(uVar29 + lVar27 * 8);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar46;
                  auVar86 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2620 + lVar27 * 4)));
                  *(undefined1 (*) [16])(pauVar26[1] + lVar37) = auVar86;
                  uVar35 = uVar35 - 1 & uVar35;
                  lVar27 = lVar37 + 0x10;
                } while (uVar35 != 0);
                pauVar41 = (undefined1 (*) [16])(pauVar26[1] + lVar37);
                if (lVar37 + 0x10 == 0) {
                  auVar88 = ZEXT3264(local_2720);
                  auVar92 = ZEXT3264(local_2740);
                  auVar93 = ZEXT3264(local_2760);
                  auVar85 = ZEXT3264(local_27c0);
                  pauVar26 = pauVar41;
                  goto joined_r0x005f8017;
                }
                lVar27 = 0x10;
                pauVar36 = pauVar26;
                do {
                  auVar86 = pauVar36[1];
                  pauVar36 = pauVar36 + 1;
                  uVar32 = vextractps_avx(auVar86,2);
                  lVar37 = lVar27;
                  do {
                    if (uVar32 <= *(uint *)(pauVar26[-1] + lVar37 + 8)) {
                      pauVar38 = (undefined1 (*) [16])(*pauVar26 + lVar37);
                      break;
                    }
                    *(undefined1 (*) [16])(*pauVar26 + lVar37) =
                         *(undefined1 (*) [16])(pauVar26[-1] + lVar37);
                    lVar37 = lVar37 + -0x10;
                    pauVar38 = pauVar26;
                  } while (lVar37 != 0);
                  *pauVar38 = auVar86;
                  lVar27 = lVar27 + 0x10;
                } while (pauVar41 != pauVar36);
                uVar46 = *(ulong *)*pauVar41;
              }
              auVar88 = ZEXT3264(local_2720);
              auVar92 = ZEXT3264(local_2740);
              auVar93 = ZEXT3264(local_2760);
            }
            auVar85 = ZEXT3264(local_27c0);
            pauVar26 = pauVar41;
            goto joined_r0x005f8017;
          }
          if (uVar11 < uVar99) {
            *(ulong *)*pauVar26 = uVar35;
            *(uint *)(*pauVar26 + 8) = uVar99;
            pauVar26 = pauVar26 + 1;
          }
          else {
            *(ulong *)*pauVar26 = uVar46;
            *(uint *)(*pauVar26 + 8) = uVar11;
            pauVar26 = pauVar26 + 1;
            uVar46 = uVar35;
          }
        }
        goto joined_r0x005f8017;
      }
      local_27e0 = (ulong)((uint)uVar46 & 0xf) - 8;
      if (local_27e0 != 0) {
        uVar46 = uVar46 & 0xfffffffffffffff0;
        local_27d8 = 0;
        local_23e0 = auVar96._0_32_;
        do {
          lVar27 = local_27d8 * 0x90;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(uVar46 + 0x40 + lVar27);
          auVar50 = vpmovzxbw_avx(auVar86);
          local_27d0 = lVar27 + uVar46;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)(uVar46 + 0x48 + lVar27);
          auVar86 = vpmovzxbw_avx(auVar14);
          auVar86 = vpminuw_avx(auVar50,auVar86);
          auVar86 = vpcmpeqw_avx(auVar50,auVar86);
          auVar86 = vpacksswb_avx(auVar86,auVar86);
          uVar28 = *(undefined4 *)(uVar46 + 0x70 + lVar27);
          auVar75._4_4_ = uVar28;
          auVar75._0_4_ = uVar28;
          auVar75._8_4_ = uVar28;
          auVar75._12_4_ = uVar28;
          auVar75._16_4_ = uVar28;
          auVar75._20_4_ = uVar28;
          auVar75._24_4_ = uVar28;
          auVar75._28_4_ = uVar28;
          uVar28 = *(undefined4 *)(uVar46 + 0x7c + lVar27);
          auVar82._4_4_ = uVar28;
          auVar82._0_4_ = uVar28;
          auVar82._8_4_ = uVar28;
          auVar82._12_4_ = uVar28;
          auVar82._16_4_ = uVar28;
          auVar82._20_4_ = uVar28;
          auVar82._24_4_ = uVar28;
          auVar82._28_4_ = uVar28;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(local_27e8 + 0x40 + local_27d0);
          auVar87 = vpmovzxbd_avx2(auVar50);
          auVar87 = vcvtdq2ps_avx(auVar87);
          auVar14 = vfmadd213ps_fma(auVar87,auVar82,auVar75);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_27f0 + 0x40 + local_27d0);
          auVar87 = vpmovzxbd_avx2(auVar4);
          auVar87 = vcvtdq2ps_avx(auVar87);
          auVar50 = vfmadd213ps_fma(auVar87,auVar82,auVar75);
          uVar28 = *(undefined4 *)(uVar46 + 0x74 + lVar27);
          auVar76._4_4_ = uVar28;
          auVar76._0_4_ = uVar28;
          auVar76._8_4_ = uVar28;
          auVar76._12_4_ = uVar28;
          auVar76._16_4_ = uVar28;
          auVar76._20_4_ = uVar28;
          auVar76._24_4_ = uVar28;
          auVar76._28_4_ = uVar28;
          uVar28 = *(undefined4 *)(uVar46 + 0x80 + lVar27);
          auVar83._4_4_ = uVar28;
          auVar83._0_4_ = uVar28;
          auVar83._8_4_ = uVar28;
          auVar83._12_4_ = uVar28;
          auVar83._16_4_ = uVar28;
          auVar83._20_4_ = uVar28;
          auVar83._24_4_ = uVar28;
          auVar83._28_4_ = uVar28;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_27f8 + 0x40 + local_27d0);
          auVar87 = vpmovzxbd_avx2(auVar5);
          auVar87 = vcvtdq2ps_avx(auVar87);
          auVar4 = vfmadd213ps_fma(auVar87,auVar83,auVar76);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_2800 + 0x40 + local_27d0);
          auVar87 = vpmovzxbd_avx2(auVar6);
          auVar87 = vcvtdq2ps_avx(auVar87);
          auVar5 = vfmadd213ps_fma(auVar87,auVar83,auVar76);
          uVar28 = *(undefined4 *)(uVar46 + 0x78 + lVar27);
          auVar77._4_4_ = uVar28;
          auVar77._0_4_ = uVar28;
          auVar77._8_4_ = uVar28;
          auVar77._12_4_ = uVar28;
          auVar77._16_4_ = uVar28;
          auVar77._20_4_ = uVar28;
          auVar77._24_4_ = uVar28;
          auVar77._28_4_ = uVar28;
          uVar28 = *(undefined4 *)(uVar46 + 0x84 + lVar27);
          auVar84._4_4_ = uVar28;
          auVar84._0_4_ = uVar28;
          auVar84._8_4_ = uVar28;
          auVar84._12_4_ = uVar28;
          auVar84._16_4_ = uVar28;
          auVar84._20_4_ = uVar28;
          auVar84._24_4_ = uVar28;
          auVar84._28_4_ = uVar28;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_2808 + 0x40 + local_27d0);
          auVar87 = vpmovzxbd_avx2(auVar7);
          auVar87 = vcvtdq2ps_avx(auVar87);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(local_2810 + 0x40 + local_27d0);
          auVar62 = vpmovzxbd_avx2(auVar8);
          auVar6 = vfmadd213ps_fma(auVar87,auVar84,auVar77);
          auVar87 = vcvtdq2ps_avx(auVar62);
          auVar7 = vfmadd213ps_fma(auVar87,auVar84,auVar77);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),local_2720,local_27c0);
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),local_2740,auVar100._0_32_);
          auVar87 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar4));
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar6),local_2760,auVar110._0_32_);
          auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),local_2720,local_27c0);
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar5),local_2740,auVar100._0_32_);
          auVar75 = vpminsd_avx2(ZEXT1632(auVar50),ZEXT1632(auVar4));
          auVar50 = vfmadd213ps_fma(ZEXT1632(auVar7),local_2760,auVar110._0_32_);
          auVar62 = vpmaxsd_avx2(ZEXT1632(auVar14),auVar113._0_32_);
          local_23c0 = vpmaxsd_avx2(auVar87,auVar62);
          auVar87 = vpminsd_avx2(ZEXT1632(auVar50),auVar96._0_32_);
          auVar87 = vpminsd_avx2(auVar75,auVar87);
          auVar87 = vpcmpgtd_avx2(local_23c0,auVar87);
          uVar28 = vmovmskps_avx(auVar87);
          bVar30 = ~(byte)uVar28 &
                   (SUB161(auVar86 >> 7,0) & 1 | (SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar86 >> 0x17,0) & 1) << 2 | (SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar86 >> 0x27,0) & 1) << 4 | (SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar86 >> 0x37,0) & 1) << 6 | SUB161(auVar86 >> 0x3f,0) << 7);
          if (bVar30 != 0) {
            local_27c8 = (ulong)bVar30;
            do {
              lVar27 = 0;
              for (uVar29 = local_27c8; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                  ) {
                lVar27 = lVar27 + 1;
              }
              fVar1 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)(local_23c0 + lVar27 * 4) <= fVar1) {
                uVar9 = *(ushort *)(local_27d0 + lVar27 * 8);
                uVar10 = *(ushort *)(local_27d0 + 2 + lVar27 * 8);
                uVar32 = *(uint *)(local_27d0 + 0x88);
                uVar11 = *(uint *)(local_27d0 + 4 + lVar27 * 8);
                pGVar12 = (context->scene->geometries).items[uVar32].ptr;
                lVar27 = *(long *)&pGVar12->field_0x58;
                lVar42 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * (ulong)uVar11;
                uVar33 = uVar9 & 0x7fff;
                uVar34 = uVar10 & 0x7fff;
                uVar99 = *(uint *)(lVar27 + 4 + lVar42);
                uVar40 = (ulong)uVar99;
                uVar35 = (ulong)(uVar99 * uVar34 + *(int *)(lVar27 + lVar42) + uVar33);
                p_Var13 = pGVar12[1].intersectionFilterN;
                lVar37 = *(long *)&pGVar12[1].time_range.upper;
                auVar86 = *(undefined1 (*) [16])(lVar37 + (uVar35 + 1) * (long)p_Var13);
                auVar14 = *(undefined1 (*) [16])(lVar37 + (uVar35 + uVar40) * (long)p_Var13);
                lVar47 = uVar35 + uVar40 + 1;
                auVar50 = *(undefined1 (*) [16])(lVar37 + lVar47 * (long)p_Var13);
                auVar4 = *(undefined1 (*) [16])
                          (lVar37 + (uVar35 + (-1 < (short)uVar9) + 1) * (long)p_Var13);
                lVar39 = (ulong)(-1 < (short)uVar9) + lVar47;
                auVar5 = *(undefined1 (*) [16])(lVar37 + lVar39 * (long)p_Var13);
                uVar29 = 0;
                if (-1 < (short)uVar10) {
                  uVar29 = uVar40;
                }
                auVar6 = *(undefined1 (*) [16])(lVar37 + (uVar35 + uVar40 + uVar29) * (long)p_Var13)
                ;
                auVar7 = *(undefined1 (*) [16])(lVar37 + (lVar47 + uVar29) * (long)p_Var13);
                auVar97._16_16_ = *(undefined1 (*) [16])(lVar37 + (uVar29 + lVar39) * (long)p_Var13)
                ;
                auVar97._0_16_ = auVar50;
                auVar114 = vunpcklps_avx(auVar86,auVar5);
                auVar8 = vunpckhps_avx(auVar86,auVar5);
                auVar74 = vunpcklps_avx(auVar4,auVar50);
                auVar4 = vunpckhps_avx(auVar4,auVar50);
                auVar89 = vunpcklps_avx(auVar8,auVar4);
                auVar53 = vunpcklps_avx(auVar114,auVar74);
                auVar4 = vunpckhps_avx(auVar114,auVar74);
                auVar114 = vunpcklps_avx(auVar14,auVar7);
                auVar8 = vunpckhps_avx(auVar14,auVar7);
                auVar74 = vunpcklps_avx(auVar50,auVar6);
                auVar6 = vunpckhps_avx(auVar50,auVar6);
                auVar8 = vunpcklps_avx(auVar8,auVar6);
                auVar48 = vunpcklps_avx(auVar114,auVar74);
                auVar6 = vunpckhps_avx(auVar114,auVar74);
                auVar78._16_16_ = auVar7;
                auVar78._0_16_ = auVar14;
                auVar63._16_16_ = auVar5;
                auVar63._0_16_ = auVar86;
                auVar87 = vunpcklps_avx(auVar63,auVar78);
                auVar54._16_16_ = auVar50;
                auVar54._0_16_ = *(undefined1 (*) [16])(lVar37 + (long)p_Var13 * uVar35);
                auVar62 = vunpcklps_avx(auVar54,auVar97);
                auVar83 = vunpcklps_avx(auVar62,auVar87);
                auVar84 = vunpckhps_avx(auVar62,auVar87);
                auVar87 = vunpckhps_avx(auVar63,auVar78);
                auVar62 = vunpckhps_avx(auVar54,auVar97);
                auVar54 = vunpcklps_avx(auVar62,auVar87);
                auVar55._16_16_ = auVar53;
                auVar55._0_16_ = auVar53;
                auVar79._16_16_ = auVar4;
                auVar79._0_16_ = auVar4;
                auVar90._16_16_ = auVar89;
                auVar90._0_16_ = auVar89;
                auVar94._16_16_ = auVar48;
                auVar94._0_16_ = auVar48;
                auVar108._16_16_ = auVar6;
                auVar108._0_16_ = auVar6;
                auVar111._16_16_ = auVar8;
                auVar111._0_16_ = auVar8;
                auVar62 = vsubps_avx(auVar83,auVar55);
                auVar87 = vsubps_avx(auVar84,auVar79);
                auVar75 = vsubps_avx(auVar54,auVar90);
                auVar76 = vsubps_avx(auVar94,auVar83);
                auVar77 = vsubps_avx(auVar108,auVar84);
                auVar82 = vsubps_avx(auVar111,auVar54);
                auVar15._4_4_ = auVar87._4_4_ * auVar82._4_4_;
                auVar15._0_4_ = auVar87._0_4_ * auVar82._0_4_;
                auVar15._8_4_ = auVar87._8_4_ * auVar82._8_4_;
                auVar15._12_4_ = auVar87._12_4_ * auVar82._12_4_;
                auVar15._16_4_ = auVar87._16_4_ * auVar82._16_4_;
                auVar15._20_4_ = auVar87._20_4_ * auVar82._20_4_;
                auVar15._24_4_ = auVar87._24_4_ * auVar82._24_4_;
                auVar15._28_4_ = auVar53._12_4_;
                auVar5 = vfmsub231ps_fma(auVar15,auVar77,auVar75);
                uVar28 = *(undefined4 *)(ray + k * 4);
                auVar115._4_4_ = uVar28;
                auVar115._0_4_ = uVar28;
                auVar115._8_4_ = uVar28;
                auVar115._12_4_ = uVar28;
                auVar115._16_4_ = uVar28;
                auVar115._20_4_ = uVar28;
                auVar115._24_4_ = uVar28;
                auVar115._28_4_ = uVar28;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x10);
                auVar117._4_4_ = uVar28;
                auVar117._0_4_ = uVar28;
                auVar117._8_4_ = uVar28;
                auVar117._12_4_ = uVar28;
                auVar117._16_4_ = uVar28;
                auVar117._20_4_ = uVar28;
                auVar117._24_4_ = uVar28;
                auVar117._28_4_ = uVar28;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
                auVar119._4_4_ = uVar28;
                auVar119._0_4_ = uVar28;
                auVar119._8_4_ = uVar28;
                auVar119._12_4_ = uVar28;
                auVar119._16_4_ = uVar28;
                auVar119._20_4_ = uVar28;
                auVar119._24_4_ = uVar28;
                auVar119._28_4_ = uVar28;
                fVar60 = *(float *)(ray + k * 4 + 0x40);
                auVar109._4_4_ = fVar60;
                auVar109._0_4_ = fVar60;
                auVar109._8_4_ = fVar60;
                auVar109._12_4_ = fVar60;
                auVar109._16_4_ = fVar60;
                auVar109._20_4_ = fVar60;
                auVar109._24_4_ = fVar60;
                auVar109._28_4_ = fVar60;
                auVar16._4_4_ = auVar75._4_4_ * auVar76._4_4_;
                auVar16._0_4_ = auVar75._0_4_ * auVar76._0_4_;
                auVar16._8_4_ = auVar75._8_4_ * auVar76._8_4_;
                auVar16._12_4_ = auVar75._12_4_ * auVar76._12_4_;
                auVar16._16_4_ = auVar75._16_4_ * auVar76._16_4_;
                auVar16._20_4_ = auVar75._20_4_ * auVar76._20_4_;
                auVar16._24_4_ = auVar75._24_4_ * auVar76._24_4_;
                auVar16._28_4_ = auVar4._12_4_;
                auVar83 = vsubps_avx(auVar83,auVar115);
                fVar66 = *(float *)(ray + k * 4 + 0x50);
                auVar114._4_4_ = fVar66;
                auVar114._0_4_ = fVar66;
                auVar114._8_4_ = fVar66;
                auVar114._12_4_ = fVar66;
                auVar116._16_4_ = fVar66;
                auVar116._0_16_ = auVar114;
                auVar116._20_4_ = fVar66;
                auVar116._24_4_ = fVar66;
                auVar116._28_4_ = fVar66;
                auVar4 = vfmsub231ps_fma(auVar16,auVar82,auVar62);
                auVar84 = vsubps_avx(auVar84,auVar117);
                fVar104 = *(float *)(ray + k * 4 + 0x60);
                auVar118._4_4_ = fVar104;
                auVar118._0_4_ = fVar104;
                auVar118._8_4_ = fVar104;
                auVar118._12_4_ = fVar104;
                auVar118._16_4_ = fVar104;
                auVar118._20_4_ = fVar104;
                auVar118._24_4_ = fVar104;
                auVar118._28_4_ = fVar104;
                auVar54 = vsubps_avx(auVar54,auVar119);
                auVar17._4_4_ = fVar60 * auVar84._4_4_;
                auVar17._0_4_ = fVar60 * auVar84._0_4_;
                auVar17._8_4_ = fVar60 * auVar84._8_4_;
                auVar17._12_4_ = fVar60 * auVar84._12_4_;
                auVar17._16_4_ = fVar60 * auVar84._16_4_;
                auVar17._20_4_ = fVar60 * auVar84._20_4_;
                auVar17._24_4_ = fVar60 * auVar84._24_4_;
                auVar17._28_4_ = uVar28;
                auVar86 = vfmsub231ps_fma(auVar17,auVar83,auVar116);
                auVar18._4_4_ = auVar82._4_4_ * auVar86._4_4_;
                auVar18._0_4_ = auVar82._0_4_ * auVar86._0_4_;
                auVar18._8_4_ = auVar82._8_4_ * auVar86._8_4_;
                auVar18._12_4_ = auVar82._12_4_ * auVar86._12_4_;
                auVar18._16_4_ = auVar82._16_4_ * 0.0;
                auVar18._20_4_ = auVar82._20_4_ * 0.0;
                auVar18._24_4_ = auVar82._24_4_ * 0.0;
                auVar18._28_4_ = auVar82._28_4_;
                auVar120._0_4_ = auVar75._0_4_ * auVar86._0_4_;
                auVar120._4_4_ = auVar75._4_4_ * auVar86._4_4_;
                auVar120._8_4_ = auVar75._8_4_ * auVar86._8_4_;
                auVar120._12_4_ = auVar75._12_4_ * auVar86._12_4_;
                auVar120._16_4_ = auVar75._16_4_ * 0.0;
                auVar120._20_4_ = auVar75._20_4_ * 0.0;
                auVar120._24_4_ = auVar75._24_4_ * 0.0;
                auVar120._28_4_ = 0;
                auVar19._4_4_ = fVar104 * auVar83._4_4_;
                auVar19._0_4_ = fVar104 * auVar83._0_4_;
                auVar19._8_4_ = fVar104 * auVar83._8_4_;
                auVar19._12_4_ = fVar104 * auVar83._12_4_;
                auVar19._16_4_ = fVar104 * auVar83._16_4_;
                auVar19._20_4_ = fVar104 * auVar83._20_4_;
                auVar19._24_4_ = fVar104 * auVar83._24_4_;
                auVar19._28_4_ = auVar75._28_4_;
                auVar14 = vfmsub231ps_fma(auVar19,auVar54,auVar109);
                auVar86 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar14),auVar77);
                auVar14 = vfmadd231ps_fma(auVar120,auVar87,ZEXT1632(auVar14));
                auVar20._4_4_ = auVar62._4_4_ * auVar77._4_4_;
                auVar20._0_4_ = auVar62._0_4_ * auVar77._0_4_;
                auVar20._8_4_ = auVar62._8_4_ * auVar77._8_4_;
                auVar20._12_4_ = auVar62._12_4_ * auVar77._12_4_;
                auVar20._16_4_ = auVar62._16_4_ * auVar77._16_4_;
                auVar20._20_4_ = auVar62._20_4_ * auVar77._20_4_;
                auVar20._24_4_ = auVar62._24_4_ * auVar77._24_4_;
                auVar20._28_4_ = auVar77._28_4_;
                auVar50 = vfmsub231ps_fma(auVar20,auVar76,auVar87);
                auVar21._4_4_ = fVar66 * auVar54._4_4_;
                auVar21._0_4_ = fVar66 * auVar54._0_4_;
                auVar21._8_4_ = fVar66 * auVar54._8_4_;
                auVar21._12_4_ = fVar66 * auVar54._12_4_;
                auVar21._16_4_ = fVar66 * auVar54._16_4_;
                auVar21._20_4_ = fVar66 * auVar54._20_4_;
                auVar21._24_4_ = fVar66 * auVar54._24_4_;
                auVar21._28_4_ = auVar87._28_4_;
                auVar6 = vfmsub231ps_fma(auVar21,auVar84,auVar118);
                fVar60 = auVar50._0_4_;
                fVar66 = auVar50._4_4_;
                auVar22._4_4_ = fVar104 * fVar66;
                auVar22._0_4_ = fVar104 * fVar60;
                fVar68 = auVar50._8_4_;
                auVar22._8_4_ = fVar104 * fVar68;
                fVar70 = auVar50._12_4_;
                auVar22._12_4_ = fVar104 * fVar70;
                auVar22._16_4_ = fVar104 * 0.0;
                auVar22._20_4_ = fVar104 * 0.0;
                auVar22._24_4_ = fVar104 * 0.0;
                auVar22._28_4_ = fVar104;
                auVar50 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar4),auVar116);
                auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),ZEXT1632(auVar5),auVar109);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),auVar76);
                auVar87 = vandps_avx(ZEXT1632(auVar50),local_2400);
                uVar99 = auVar87._0_4_;
                auVar95._0_4_ = (float)(uVar99 ^ auVar86._0_4_);
                uVar101 = auVar87._4_4_;
                auVar95._4_4_ = (float)(uVar101 ^ auVar86._4_4_);
                uVar102 = auVar87._8_4_;
                auVar95._8_4_ = (float)(uVar102 ^ auVar86._8_4_);
                uVar103 = auVar87._12_4_;
                auVar95._12_4_ = (float)(uVar103 ^ auVar86._12_4_);
                fVar104 = auVar87._16_4_;
                auVar95._16_4_ = fVar104;
                fVar105 = auVar87._20_4_;
                auVar95._20_4_ = fVar105;
                fVar106 = auVar87._24_4_;
                auVar95._24_4_ = fVar106;
                fVar107 = auVar87._28_4_;
                auVar95._28_4_ = fVar107;
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar62,ZEXT1632(auVar6));
                auVar98._0_4_ = (float)(uVar99 ^ auVar86._0_4_);
                auVar98._4_4_ = (float)(uVar101 ^ auVar86._4_4_);
                auVar98._8_4_ = (float)(uVar102 ^ auVar86._8_4_);
                auVar98._12_4_ = (float)(uVar103 ^ auVar86._12_4_);
                auVar98._16_4_ = fVar104;
                auVar98._20_4_ = fVar105;
                auVar98._24_4_ = fVar106;
                auVar98._28_4_ = fVar107;
                auVar87 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
                auVar62 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
                auVar87 = vandps_avx(auVar62,auVar87);
                auVar64._8_4_ = 0x7fffffff;
                auVar64._0_8_ = 0x7fffffff7fffffff;
                auVar64._12_4_ = 0x7fffffff;
                auVar64._16_4_ = 0x7fffffff;
                auVar64._20_4_ = 0x7fffffff;
                auVar64._24_4_ = 0x7fffffff;
                auVar64._28_4_ = 0x7fffffff;
                local_25c0 = vandps_avx(ZEXT1632(auVar50),auVar64);
                auVar62 = vcmpps_avx(ZEXT1632(auVar50),ZEXT832(0) << 0x20,4);
                auVar87 = vandps_avx(auVar87,auVar62);
                auVar112._0_4_ = auVar95._0_4_ + auVar98._0_4_;
                auVar112._4_4_ = auVar95._4_4_ + auVar98._4_4_;
                auVar112._8_4_ = auVar95._8_4_ + auVar98._8_4_;
                auVar112._12_4_ = auVar95._12_4_ + auVar98._12_4_;
                auVar112._16_4_ = fVar104 + fVar104;
                auVar112._20_4_ = fVar105 + fVar105;
                auVar112._24_4_ = fVar106 + fVar106;
                auVar112._28_4_ = fVar107 + fVar107;
                auVar62 = vcmpps_avx(auVar112,local_25c0,2);
                auVar75 = auVar62 & auVar87;
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar75 >> 0x7f,0) != '\0') ||
                      (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0xbf,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar75[0x1f] < '\0') {
                  auVar87 = vandps_avx(auVar87,auVar62);
                  auVar86 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
                  auVar23._4_4_ = fVar66 * auVar54._4_4_;
                  auVar23._0_4_ = fVar60 * auVar54._0_4_;
                  auVar23._8_4_ = fVar68 * auVar54._8_4_;
                  auVar23._12_4_ = fVar70 * auVar54._12_4_;
                  auVar23._16_4_ = auVar54._16_4_ * 0.0;
                  auVar23._20_4_ = auVar54._20_4_ * 0.0;
                  auVar23._24_4_ = auVar54._24_4_ * 0.0;
                  auVar23._28_4_ = auVar54._28_4_;
                  auVar14 = vfmadd213ps_fma(auVar84,ZEXT1632(auVar4),auVar23);
                  auVar14 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar5),ZEXT1632(auVar14));
                  local_25e0._0_4_ = (float)(uVar99 ^ auVar14._0_4_);
                  local_25e0._4_4_ = (float)(uVar101 ^ auVar14._4_4_);
                  local_25e0._8_4_ = (float)(uVar102 ^ auVar14._8_4_);
                  local_25e0._12_4_ = (float)(uVar103 ^ auVar14._12_4_);
                  local_25e0._16_4_ = fVar104;
                  local_25e0._20_4_ = fVar105;
                  local_25e0._24_4_ = fVar106;
                  local_25e0._28_4_ = fVar107;
                  fVar107 = *(float *)(ray + k * 4 + 0x30);
                  fVar59 = local_25c0._0_4_;
                  fVar65 = local_25c0._4_4_;
                  auVar24._4_4_ = fVar65 * fVar107;
                  auVar24._0_4_ = fVar59 * fVar107;
                  fVar67 = local_25c0._8_4_;
                  auVar24._8_4_ = fVar67 * fVar107;
                  fVar69 = local_25c0._12_4_;
                  auVar24._12_4_ = fVar69 * fVar107;
                  fVar71 = local_25c0._16_4_;
                  auVar24._16_4_ = fVar71 * fVar107;
                  fVar72 = local_25c0._20_4_;
                  auVar24._20_4_ = fVar72 * fVar107;
                  fVar73 = local_25c0._24_4_;
                  auVar24._24_4_ = fVar73 * fVar107;
                  auVar24._28_4_ = fVar107;
                  auVar87 = vcmpps_avx(auVar24,local_25e0,1);
                  auVar25._4_4_ = fVar1 * fVar65;
                  auVar25._0_4_ = fVar1 * fVar59;
                  auVar25._8_4_ = fVar1 * fVar67;
                  auVar25._12_4_ = fVar1 * fVar69;
                  auVar25._16_4_ = fVar1 * fVar71;
                  auVar25._20_4_ = fVar1 * fVar72;
                  auVar25._24_4_ = fVar1 * fVar73;
                  auVar25._28_4_ = fVar1;
                  auVar62 = vcmpps_avx(local_25e0,auVar25,2);
                  auVar87 = vandps_avx(auVar62,auVar87);
                  auVar14 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
                  auVar86 = vpand_avx(auVar86,auVar14);
                  auVar87 = vpmovzxwd_avx2(auVar86);
                  auVar87 = vpslld_avx2(auVar87,0x1f);
                  if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0x7f,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar87 >> 0xbf,0) != '\0') ||
                      (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar87[0x1f] < '\0') {
                    local_2580 = vpsrad_avx2(auVar87,0x1f);
                    auVar62 = vsubps_avx(local_25c0,auVar98);
                    auVar62 = vblendvps_avx(auVar95,auVar62,local_2480);
                    auVar75 = vsubps_avx(local_25c0,auVar95);
                    local_2600 = vblendvps_avx(auVar98,auVar75,local_2480);
                    local_2500._0_4_ = (float)local_24a0._0_4_ * auVar5._0_4_;
                    local_2500._4_4_ = (float)local_24a0._4_4_ * auVar5._4_4_;
                    local_2500._8_4_ = fStack_2498 * auVar5._8_4_;
                    local_2500._12_4_ = fStack_2494 * auVar5._12_4_;
                    local_2500._16_4_ = fStack_2490 * 0.0;
                    local_2500._20_4_ = fStack_248c * 0.0;
                    local_2500._24_4_ = fStack_2488 * 0.0;
                    local_2500._28_4_ = 0;
                    local_24e0._4_4_ = (float)local_24a0._4_4_ * auVar4._4_4_;
                    local_24e0._0_4_ = (float)local_24a0._0_4_ * auVar4._0_4_;
                    local_24e0._8_4_ = fStack_2498 * auVar4._8_4_;
                    local_24e0._12_4_ = fStack_2494 * auVar4._12_4_;
                    local_24e0._16_4_ = fStack_2490 * 0.0;
                    local_24e0._20_4_ = fStack_248c * 0.0;
                    local_24e0._24_4_ = fStack_2488 * 0.0;
                    local_24e0._28_4_ = 0;
                    local_24c0._4_4_ = (float)local_24a0._4_4_ * fVar66;
                    local_24c0._0_4_ = (float)local_24a0._0_4_ * fVar60;
                    local_24c0._8_4_ = fStack_2498 * fVar68;
                    local_24c0._12_4_ = fStack_2494 * fVar70;
                    local_24c0._16_4_ = fStack_2490 * 0.0;
                    local_24c0._20_4_ = fStack_248c * 0.0;
                    local_24c0._24_4_ = fStack_2488 * 0.0;
                    local_24c0._28_4_ = 0;
                    auVar74._0_4_ = (float)(int)(*(ushort *)(lVar27 + 8 + lVar42) - 1);
                    auVar74._4_12_ = auVar114._4_12_;
                    auVar56._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                    auVar56._8_4_ = uVar33;
                    auVar56._12_4_ = uVar33;
                    auVar56._16_4_ = uVar33;
                    auVar56._20_4_ = uVar33;
                    auVar56._24_4_ = uVar33;
                    auVar56._28_4_ = uVar33;
                    auVar75 = vpaddd_avx2(auVar56,_DAT_01fec4a0);
                    auVar86 = vrcpss_avx(auVar74,auVar74);
                    auVar14 = vfnmadd213ss_fma(auVar86,auVar74,ZEXT416(0x40000000));
                    fStack_2608 = auVar14._0_4_ * auVar86._0_4_;
                    auVar75 = vcvtdq2ps_avx(auVar75);
                    fStack_2604 = auVar62._28_4_ + auVar75._28_4_;
                    local_2620._0_4_ = (auVar62._0_4_ + fVar59 * auVar75._0_4_) * fStack_2608;
                    local_2620._4_4_ = (auVar62._4_4_ + fVar65 * auVar75._4_4_) * fStack_2608;
                    fStack_2618 = (auVar62._8_4_ + fVar67 * auVar75._8_4_) * fStack_2608;
                    fStack_2614 = (auVar62._12_4_ + fVar69 * auVar75._12_4_) * fStack_2608;
                    fStack_2610 = (auVar62._16_4_ + fVar71 * auVar75._16_4_) * fStack_2608;
                    fStack_260c = (auVar62._20_4_ + fVar72 * auVar75._20_4_) * fStack_2608;
                    fStack_2608 = (auVar62._24_4_ + fVar73 * auVar75._24_4_) * fStack_2608;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar80._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                      auVar80._8_4_ = uVar34;
                      auVar80._12_4_ = uVar34;
                      auVar80._16_4_ = uVar34;
                      auVar80._20_4_ = uVar34;
                      auVar80._24_4_ = uVar34;
                      auVar80._28_4_ = uVar34;
                      auVar62 = vpaddd_avx2(auVar80,_DAT_01fec4c0);
                      auVar62 = vcvtdq2ps_avx(auVar62);
                      auVar89._0_4_ = (float)(int)(*(ushort *)(lVar27 + 10 + lVar42) - 1);
                      auVar89._4_12_ = auVar114._4_12_;
                      auVar86 = vrcpss_avx(auVar89,auVar89);
                      auVar14 = vfnmadd213ss_fma(auVar86,auVar89,ZEXT416(0x40000000));
                      fVar1 = auVar14._0_4_ * auVar86._0_4_;
                      auVar75 = vrcpps_avx(local_25c0);
                      auVar91._8_4_ = 0x3f800000;
                      auVar91._0_8_ = 0x3f8000003f800000;
                      auVar91._12_4_ = 0x3f800000;
                      auVar91._16_4_ = 0x3f800000;
                      auVar91._20_4_ = 0x3f800000;
                      auVar91._24_4_ = 0x3f800000;
                      auVar91._28_4_ = 0x3f800000;
                      auVar86 = vfnmadd213ps_fma(local_25c0,auVar75,auVar91);
                      auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar75,auVar75);
                      fVar60 = auVar86._0_4_;
                      fVar66 = auVar86._4_4_;
                      local_26e0._4_4_ = fVar66 * local_25e0._4_4_;
                      local_26e0._0_4_ = fVar60 * local_25e0._0_4_;
                      fVar68 = auVar86._8_4_;
                      local_26e0._8_4_ = fVar68 * local_25e0._8_4_;
                      fVar70 = auVar86._12_4_;
                      local_26e0._12_4_ = fVar70 * local_25e0._12_4_;
                      local_26e0._16_4_ = fVar104 * 0.0;
                      local_26e0._20_4_ = fVar105 * 0.0;
                      local_26e0._24_4_ = fVar106 * 0.0;
                      local_26e0._28_4_ = 0x3f800000;
                      auVar85 = ZEXT3264(local_26e0);
                      local_2520 = local_26e0;
                      local_2560[0] = (float)local_2620._0_4_ * fVar60;
                      local_2560[1] = (float)local_2620._4_4_ * fVar66;
                      local_2560[2] = fStack_2618 * fVar68;
                      local_2560[3] = fStack_2614 * fVar70;
                      fStack_2550 = fStack_2610 * 0.0;
                      fStack_254c = fStack_260c * 0.0;
                      fStack_2548 = fStack_2608 * 0.0;
                      fStack_2544 = fStack_2604;
                      local_2540[0] = (fVar59 * auVar62._0_4_ + local_2600._0_4_) * fVar1 * fVar60;
                      local_2540[1] = (fVar65 * auVar62._4_4_ + local_2600._4_4_) * fVar1 * fVar66;
                      local_2540[2] = (fVar67 * auVar62._8_4_ + local_2600._8_4_) * fVar1 * fVar68;
                      local_2540[3] = (fVar69 * auVar62._12_4_ + local_2600._12_4_) * fVar1 * fVar70
                      ;
                      fStack_2530 = (fVar71 * auVar62._16_4_ + local_2600._16_4_) * fVar1 * 0.0;
                      fStack_252c = (fVar72 * auVar62._20_4_ + local_2600._20_4_) * fVar1 * 0.0;
                      fStack_2528 = (fVar73 * auVar62._24_4_ + local_2600._24_4_) * fVar1 * 0.0;
                      fStack_2524 = fStack_2604;
                      auVar57._8_4_ = 0x7f800000;
                      auVar57._0_8_ = 0x7f8000007f800000;
                      auVar57._12_4_ = 0x7f800000;
                      auVar57._16_4_ = 0x7f800000;
                      auVar57._20_4_ = 0x7f800000;
                      auVar57._24_4_ = 0x7f800000;
                      auVar57._28_4_ = 0x7f800000;
                      auVar62 = vblendvps_avx(auVar57,local_26e0,auVar87);
                      auVar75 = vshufps_avx(auVar62,auVar62,0xb1);
                      auVar75 = vminps_avx(auVar62,auVar75);
                      auVar76 = vshufpd_avx(auVar75,auVar75,5);
                      auVar75 = vminps_avx(auVar75,auVar76);
                      auVar76 = vpermpd_avx2(auVar75,0x4e);
                      auVar75 = vminps_avx(auVar75,auVar76);
                      auVar75 = vcmpps_avx(auVar62,auVar75,0);
                      auVar76 = local_2580 & auVar75;
                      auVar62 = local_2580;
                      if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar76 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar76 >> 0x7f,0) != '\0') ||
                            (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar76 >> 0xbf,0) != '\0') ||
                          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar76[0x1f] < '\0') {
                        auVar62 = vandps_avx(auVar75,local_2580);
                      }
                      uVar33 = vmovmskps_avx(auVar62);
                      uVar99 = 0;
                      for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                        uVar99 = uVar99 + 1;
                      }
                      uVar29 = (ulong)uVar99;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar1 = local_2560[uVar29];
                        fVar60 = local_2540[uVar29];
                        uVar28 = *(undefined4 *)(local_2500 + uVar29 * 4);
                        uVar2 = *(undefined4 *)(local_24e0 + uVar29 * 4);
                        uVar3 = *(undefined4 *)(local_24c0 + uVar29 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_2520 + uVar29 * 4);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar28;
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar3;
                        *(float *)(ray + k * 4 + 0xf0) = fVar1;
                        *(float *)(ray + k * 4 + 0x100) = fVar60;
                        *(uint *)(ray + k * 4 + 0x110) = uVar11;
                        *(uint *)(ray + k * 4 + 0x120) = uVar32;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_2850 = CONCAT44(uVar11,uVar11);
                        auVar14 = *local_2818;
                        local_2870 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                        auVar86 = vpcmpeqd_avx(auVar87._0_16_,auVar87._0_16_);
                        auVar88 = ZEXT1664(auVar86);
                        local_2700 = local_2580;
                        while( true ) {
                          local_2680 = local_2560[uVar29];
                          local_2670 = local_2540[uVar29];
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_2520 + uVar29 * 4);
                          local_2790.context = context->user;
                          local_26b0 = *(undefined4 *)(local_2500 + uVar29 * 4);
                          uVar28 = *(undefined4 *)(local_24e0 + uVar29 * 4);
                          local_26a0._4_4_ = uVar28;
                          local_26a0._0_4_ = uVar28;
                          local_26a0._8_4_ = uVar28;
                          local_26a0._12_4_ = uVar28;
                          uVar28 = *(undefined4 *)(local_24c0 + uVar29 * 4);
                          local_2690._4_4_ = uVar28;
                          local_2690._0_4_ = uVar28;
                          local_2690._8_4_ = uVar28;
                          local_2690._12_4_ = uVar28;
                          uStack_26ac = local_26b0;
                          uStack_26a8 = local_26b0;
                          uStack_26a4 = local_26b0;
                          fStack_267c = local_2680;
                          fStack_2678 = local_2680;
                          fStack_2674 = local_2680;
                          fStack_266c = local_2670;
                          fStack_2668 = local_2670;
                          fStack_2664 = local_2670;
                          local_2660 = local_2850;
                          uStack_2658 = CONCAT44(uVar11,uVar11);
                          local_2650._4_4_ = uVar32;
                          local_2650._0_4_ = uVar32;
                          local_2650._8_4_ = uVar32;
                          local_2650._12_4_ = uVar32;
                          vpcmpeqd_avx2(ZEXT1632(local_2650),ZEXT1632(local_2650));
                          uStack_263c = (local_2790.context)->instID[0];
                          local_2640 = uStack_263c;
                          uStack_2638 = uStack_263c;
                          uStack_2634 = uStack_263c;
                          uStack_2630 = (local_2790.context)->instPrimID[0];
                          uStack_262c = uStack_2630;
                          uStack_2628 = uStack_2630;
                          uStack_2624 = uStack_2630;
                          local_2790.geometryUserPtr = pGVar12->userPtr;
                          local_2790.hit = (RTCHitN *)&local_26b0;
                          local_2790.N = 4;
                          local_2830 = auVar14;
                          local_2790.valid = (int *)local_2830;
                          local_2790.ray = (RTCRayN *)ray;
                          if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar86 = auVar88._0_16_;
                            (*pGVar12->intersectionFilterN)(&local_2790);
                            auVar85 = ZEXT3264(local_26e0);
                            auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                            auVar88 = ZEXT1664(auVar86);
                          }
                          auVar86 = auVar88._0_16_;
                          if (local_2830 == (undefined1  [16])0x0) {
                            auVar50 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar50 = auVar50 ^ auVar86;
                          }
                          else {
                            p_Var13 = context->args->filter;
                            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var13)(&local_2790);
                              auVar85 = ZEXT3264(local_26e0);
                              auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                              auVar88 = ZEXT1664(auVar86);
                            }
                            auVar86 = vpcmpeqd_avx(local_2830,_DAT_01f7aa10);
                            auVar50 = auVar86 ^ auVar88._0_16_;
                            if (local_2830 != (undefined1  [16])0x0) {
                              auVar86 = auVar86 ^ auVar88._0_16_;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])local_2790.hit);
                              *(undefined1 (*) [16])(local_2790.ray + 0xc0) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x10));
                              *(undefined1 (*) [16])(local_2790.ray + 0xd0) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x20));
                              *(undefined1 (*) [16])(local_2790.ray + 0xe0) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x30));
                              *(undefined1 (*) [16])(local_2790.ray + 0xf0) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x40));
                              *(undefined1 (*) [16])(local_2790.ray + 0x100) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x50));
                              *(undefined1 (*) [16])(local_2790.ray + 0x110) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x60));
                              *(undefined1 (*) [16])(local_2790.ray + 0x120) = auVar4;
                              auVar4 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                               (local_2790.hit + 0x70));
                              *(undefined1 (*) [16])(local_2790.ray + 0x130) = auVar4;
                              auVar86 = vmaskmovps_avx(auVar86,*(undefined1 (*) [16])
                                                                (local_2790.hit + 0x80));
                              *(undefined1 (*) [16])(local_2790.ray + 0x140) = auVar86;
                            }
                          }
                          auVar53._8_8_ = 0x100000001;
                          auVar53._0_8_ = 0x100000001;
                          if ((auVar53 & auVar50) == (undefined1  [16])0x0) {
                            *(undefined4 *)(ray + k * 4 + 0x80) = local_2870._0_4_;
                          }
                          else {
                            local_2870._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                            local_2870._4_4_ = 0;
                            local_2870._8_4_ = 0;
                            local_2870._12_4_ = 0;
                          }
                          *(undefined4 *)(local_2700 + uVar29 * 4) = 0;
                          auVar51._4_4_ = local_2870._0_4_;
                          auVar51._0_4_ = local_2870._0_4_;
                          auVar51._8_4_ = local_2870._0_4_;
                          auVar51._12_4_ = local_2870._0_4_;
                          auVar51._16_4_ = local_2870._0_4_;
                          auVar51._20_4_ = local_2870._0_4_;
                          auVar51._24_4_ = local_2870._0_4_;
                          auVar51._28_4_ = local_2870._0_4_;
                          auVar62 = vcmpps_avx(auVar85._0_32_,auVar51,2);
                          auVar87 = vandps_avx(auVar62,local_2700);
                          local_2700 = local_2700 & auVar62;
                          if ((((((((local_2700 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_2700 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_2700 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_2700 >> 0x7f,0) == '\0') &&
                                (local_2700 & (undefined1  [32])0x100000000) ==
                                (undefined1  [32])0x0) && SUB321(local_2700 >> 0xbf,0) == '\0') &&
                              (local_2700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < local_2700[0x1f]) break;
                          auVar58._8_4_ = 0x7f800000;
                          auVar58._0_8_ = 0x7f8000007f800000;
                          auVar58._12_4_ = 0x7f800000;
                          auVar58._16_4_ = 0x7f800000;
                          auVar58._20_4_ = 0x7f800000;
                          auVar58._24_4_ = 0x7f800000;
                          auVar58._28_4_ = 0x7f800000;
                          auVar62 = vblendvps_avx(auVar58,auVar85._0_32_,auVar87);
                          auVar75 = vshufps_avx(auVar62,auVar62,0xb1);
                          auVar75 = vminps_avx(auVar62,auVar75);
                          auVar76 = vshufpd_avx(auVar75,auVar75,5);
                          auVar75 = vminps_avx(auVar75,auVar76);
                          auVar76 = vpermpd_avx2(auVar75,0x4e);
                          auVar75 = vminps_avx(auVar75,auVar76);
                          auVar75 = vcmpps_avx(auVar62,auVar75,0);
                          auVar76 = auVar87 & auVar75;
                          auVar62 = auVar87;
                          if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar76 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar76 >> 0x7f,0) != '\0') ||
                                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar76 >> 0xbf,0) != '\0') ||
                              (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar76[0x1f] < '\0') {
                            auVar62 = vandps_avx(auVar75,auVar87);
                          }
                          uVar33 = vmovmskps_avx(auVar62);
                          uVar99 = 0;
                          for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                            uVar99 = uVar99 + 1;
                          }
                          uVar29 = (ulong)uVar99;
                          local_2700 = auVar87;
                        }
                      }
                    }
                  }
                }
                auVar96 = ZEXT3264(local_23e0);
                auVar100 = ZEXT3264(local_2420);
                auVar110 = ZEXT3264(local_2440);
                auVar113 = ZEXT3264(local_2460);
              }
              local_27c8 = local_27c8 - 1 & local_27c8;
            } while (local_27c8 != 0);
          }
          local_27d8 = local_27d8 + 1;
        } while (local_27d8 != local_27e0);
      }
      uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar96 = ZEXT3264(CONCAT428(uVar28,CONCAT424(uVar28,CONCAT420(uVar28,CONCAT416(uVar28,
                                                  CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,
                                                  uVar28))))))));
      auVar88 = ZEXT3264(local_2720);
      auVar92 = ZEXT3264(local_2740);
      auVar93 = ZEXT3264(local_2760);
      auVar85 = ZEXT3264(local_27c0);
    }
    if (pauVar26 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }